

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::DebugString
          (ServiceDescriptor *this,string *contents,DebugStringOptions *debug_string_options)

{
  int iVar1;
  string *value;
  ServiceOptions *options;
  FileDescriptor *this_00;
  DescriptorPool *pool;
  MethodDescriptor *this_01;
  int local_2d4;
  undefined1 local_2d0 [4];
  int i;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [8];
  SourceLocationCommentPrinter comment_printer;
  DebugStringOptions *debug_string_options_local;
  string *contents_local;
  ServiceDescriptor *this_local;
  
  comment_printer.prefix_.field_2._8_8_ = debug_string_options;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"",&local_d9);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::ServiceDescriptor>
            ((SourceLocationCommentPrinter *)local_b8,this,&local_d8,
             (DebugStringOptions *)comment_printer.prefix_.field_2._8_8_);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)local_b8,contents);
  value = name_abi_cxx11_(this);
  strings::internal::SubstituteArg::SubstituteArg(&local_120,value);
  strings::internal::SubstituteArg::SubstituteArg(&local_150);
  strings::internal::SubstituteArg::SubstituteArg(&local_180);
  strings::internal::SubstituteArg::SubstituteArg(&local_1b0);
  strings::internal::SubstituteArg::SubstituteArg(&local_1e0);
  strings::internal::SubstituteArg::SubstituteArg(&local_210);
  strings::internal::SubstituteArg::SubstituteArg(&local_240);
  strings::internal::SubstituteArg::SubstituteArg(&local_270);
  strings::internal::SubstituteArg::SubstituteArg(&local_2a0);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_2d0);
  strings::SubstituteAndAppend
            (contents,"service $0 {\n",&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
             &local_210,&local_240,&local_270,&local_2a0,(SubstituteArg *)local_2d0);
  options = ServiceDescriptor::options(this);
  this_00 = file(this);
  pool = FileDescriptor::pool(this_00);
  anon_unknown_1::FormatLineOptions(1,&options->super_Message,pool,contents);
  local_2d4 = 0;
  while( true ) {
    iVar1 = method_count(this);
    if (iVar1 <= local_2d4) break;
    this_01 = method(this,local_2d4);
    MethodDescriptor::DebugString
              (this_01,1,contents,(DebugStringOptions *)comment_printer.prefix_.field_2._8_8_);
    local_2d4 = local_2d4 + 1;
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            ((SourceLocationCommentPrinter *)local_b8,contents);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
            ((SourceLocationCommentPrinter *)local_b8);
  return;
}

Assistant:

void ServiceDescriptor::DebugString(string *contents,
                                    const DebugStringOptions&
                                    debug_string_options) const {
  SourceLocationCommentPrinter
      comment_printer(this, /* prefix */ "", debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "service $0 {\n", name());

  FormatLineOptions(1, options(), file()->pool(), contents);

  for (int i = 0; i < method_count(); i++) {
    method(i)->DebugString(1, contents, debug_string_options);
  }

  contents->append("}\n");

  comment_printer.AddPostComment(contents);
}